

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.cpp
# Opt level: O1

Matrix __thiscall maths::operator+(maths *this,Matrix *m1,Matrix *m2)

{
  double **ppdVar1;
  double *pdVar2;
  double *pdVar3;
  double **extraout_RDX;
  long lVar4;
  ulong uVar5;
  Matrix MVar6;
  Matrix temp;
  Matrix local_28;
  
  Matrix::Matrix(&local_28,m1);
  if (0 < (long)local_28.rows_) {
    ppdVar1 = m2->p;
    lVar4 = 0;
    do {
      if (0 < local_28.cols_) {
        pdVar2 = ppdVar1[lVar4];
        pdVar3 = local_28.p[lVar4];
        uVar5 = 0;
        do {
          pdVar3[uVar5] = pdVar2[uVar5] + pdVar3[uVar5];
          uVar5 = uVar5 + 1;
        } while ((uint)local_28.cols_ != uVar5);
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != local_28.rows_);
  }
  Matrix::Matrix((Matrix *)this,&local_28);
  Matrix::~Matrix(&local_28);
  MVar6.p = extraout_RDX;
  MVar6._0_8_ = this;
  return MVar6;
}

Assistant:

Matrix operator+(const Matrix& m1, const Matrix& m2)
{
    Matrix temp(m1);
    return (temp += m2);
}